

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operations.cpp
# Opt level: O0

int __thiscall boost::filesystem::detail::copy(detail *this,EVP_PKEY_CTX *dst,EVP_PKEY_CTX *src)

{
  file_status this_00;
  bool bVar1;
  unspecified_bool_type p_Var2;
  unspecified_bool_type extraout_RAX;
  unspecified_bool_type extraout_RAX_00;
  unspecified_bool_type extraout_RAX_01;
  filesystem_error *this_01;
  error_category *peVar3;
  unspecified_bool_type extraout_RAX_02;
  error_code ec;
  error_code local_88 [2];
  allocator<char> local_61;
  string local_60;
  file_status local_40;
  file_status local_38;
  file_status local_30;
  undefined1 local_28 [8];
  file_status s;
  error_code *ec_local;
  path *to_local;
  path *from_local;
  
  s = (file_status)src;
  filesystem::symlink_status((path *)local_28,(error_code *)this);
  if ((s == (file_status)0x0) ||
     (p_Var2 = system::error_code::operator_cast_to_function_pointer((error_code *)s),
     p_Var2 == (unspecified_bool_type)0x0)) {
    file_status::file_status(&local_30,(file_status *)local_28);
    bVar1 = is_symlink(&local_30);
    if (bVar1) {
      filesystem::copy_symlink((path *)this,(path *)dst,(error_code *)s);
      p_Var2 = extraout_RAX;
    }
    else {
      file_status::file_status(&local_38,(file_status *)local_28);
      bVar1 = is_directory(&local_38);
      if (bVar1) {
        filesystem::copy_directory((path *)this,(path *)dst,(error_code *)s);
        p_Var2 = extraout_RAX_00;
      }
      else {
        file_status::file_status(&local_40,(file_status *)local_28);
        bVar1 = is_regular_file(&local_40);
        this_00 = s;
        if (bVar1) {
          filesystem::copy_file((path *)this,(path *)dst,fail_if_exists,(error_code *)s);
          p_Var2 = extraout_RAX_01;
        }
        else {
          if (s == (file_status)0x0) {
            this_01 = (filesystem_error *)__cxa_allocate_exception(0x50);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_60,"boost::filesystem::copy",&local_61);
            peVar3 = system::system_category();
            system::error_code::error_code(local_88,0x26,peVar3);
            ec._4_4_ = 0;
            ec.m_val = local_88[0].m_val;
            ec.m_cat = local_88[0].m_cat;
            filesystem_error::filesystem_error(this_01,&local_60,(path *)this,(path *)dst,ec);
            __cxa_throw(this_01,&filesystem_error::typeinfo,filesystem_error::~filesystem_error);
          }
          peVar3 = system::system_category();
          system::error_code::assign((error_code *)this_00,0x26,peVar3);
          p_Var2 = extraout_RAX_02;
        }
      }
    }
  }
  return (int)p_Var2;
}

Assistant:

BOOST_FILESYSTEM_DECL
  void copy(const path& from, const path& to, system::error_code* ec)
  {
    file_status s(symlink_status(from, *ec));
    if (ec != 0 && *ec) return;

    if(is_symlink(s))
    {
      copy_symlink(from, to, *ec);
    }
    else if(is_directory(s))
    {
      copy_directory(from, to, *ec);
    }
    else if(is_regular_file(s))
    {
      copy_file(from, to, fs::copy_option::fail_if_exists, *ec);
    }
    else
    {
      if (ec == 0)
        BOOST_FILESYSTEM_THROW(filesystem_error("boost::filesystem::copy",
          from, to, error_code(BOOST_ERROR_NOT_SUPPORTED, system_category())));
      ec->assign(BOOST_ERROR_NOT_SUPPORTED, system_category());
    }
  }